

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O1

char * __thiscall XMLParser::ToXMLStringTool::toXML(ToXMLStringTool *this,char *source)

{
  int iVar1;
  void *pvVar2;
  char *dest;
  
  if (source == (char *)0x0) {
    if (*(int *)(this + 8) < 1) {
      *(undefined4 *)(this + 8) = 1;
      pvVar2 = malloc(1);
      *(void **)this = pvVar2;
    }
    **(undefined1 **)this = 0;
    dest = *(char **)this;
  }
  else {
    iVar1 = lengthXMLString(source);
    if (*(int *)(this + 8) <= iVar1) {
      if (*(void **)this != (void *)0x0) {
        free(*(void **)this);
      }
      *(undefined8 *)this = 0;
      *(int *)(this + 8) = iVar1 + 1;
      pvVar2 = malloc((long)(iVar1 + 1));
      *(void **)this = pvVar2;
    }
    dest = *(char **)this;
    toXMLUnSafe(dest,source);
  }
  return dest;
}

Assistant:

XMLSTR ToXMLStringTool::toXML(XMLCSTR source)
    {
        if(!source)
        {
            if(buflen < 1)
            {
                buflen = 1;
                buf = (XMLSTR)malloc(sizeof(XMLCHAR));
            }
            *buf = 0;
            return buf;
        }
        int l = lengthXMLString(source) + 1;
        if(l > buflen)
        {
            freeBuffer();
            buflen = l;
            buf = (XMLSTR)malloc(l * sizeof(XMLCHAR));
        }
        return toXMLUnSafe(buf, source);
    }